

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
initialize(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,int num_keys,double density)

{
  int iVar1;
  long lVar2;
  unsigned_long *__s;
  int *piVar3;
  size_t __n;
  undefined1 auVar4 [16];
  new_allocator<int> local_1b;
  new_allocator<int> local_1a;
  new_allocator<unsigned_long> local_19;
  
  this->num_keys_ = num_keys;
  iVar1 = num_keys + 1;
  if (num_keys + 1 <= (int)((double)num_keys / density)) {
    iVar1 = (int)((double)num_keys / density);
  }
  this->data_capacity_ = iVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (double)iVar1 * 0.015625;
  auVar4 = vroundsd_avx(auVar4,auVar4,10);
  lVar2 = vcvttsd2usi_avx512f(auVar4);
  this->bitmap_size_ = (int)lVar2;
  __s = __gnu_cxx::new_allocator<unsigned_long>::allocate(&local_19,(long)(int)lVar2,(void *)0x0);
  __n = 0xffffffffffffffff;
  if (-1 < lVar2 << 0x20) {
    __n = (lVar2 << 0x20) >> 0x1d;
  }
  memset(__s,0,__n);
  this->bitmap_ = __s;
  piVar3 = __gnu_cxx::new_allocator<int>::allocate(&local_1a,(long)this->data_capacity_,(void *)0x0)
  ;
  this->key_slots_ = piVar3;
  piVar3 = __gnu_cxx::new_allocator<int>::allocate(&local_1b,(long)this->data_capacity_,(void *)0x0)
  ;
  this->payload_slots_ = piVar3;
  return;
}

Assistant:

void initialize(int num_keys, double density) {
    num_keys_ = num_keys;
    data_capacity_ =
        std::max(static_cast<int>(num_keys / density), num_keys + 1);
    bitmap_size_ = static_cast<size_t>(std::ceil(data_capacity_ / 64.));
    bitmap_ = new (bitmap_allocator().allocate(bitmap_size_))
        uint64_t[bitmap_size_]();  // initialize to all false
#if ALEX_DATA_NODE_SEP_ARRAYS
    key_slots_ =
        new (key_allocator().allocate(data_capacity_)) T[data_capacity_];
    payload_slots_ =
        new (payload_allocator().allocate(data_capacity_)) P[data_capacity_];
#else
    data_slots_ =
        new (value_allocator().allocate(data_capacity_)) V[data_capacity];
#endif
  }